

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleCaseBase::TriangleCaseBase
          (TriangleCaseBase *this,Context *context,char *name,char *description,
          TriangleData *polysBegin,TriangleData *polysEnd,WindowRectangle *viewport)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TriangleData *__cur;
  long lVar5;
  pointer pTVar6;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_RenderTestCase).super_TestCase.m_context = context;
  (this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_021974b8;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = (long)polysEnd - (long)polysBegin >> 5;
  if ((ulong)(lVar5 * -0x5555555555555555) < 0x155555555555556) {
    if (polysEnd == polysBegin) {
      pTVar6 = (pointer)0x0;
    }
    else {
      pTVar6 = (pointer)operator_new((long)polysEnd - (long)polysBegin);
    }
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar6;
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(&pTVar6->p0 + lVar5 * 2);
    if (polysEnd != polysBegin) {
      do {
        uVar1 = *(undefined8 *)((polysBegin->p0).m_data + 2);
        *(undefined8 *)(pTVar6->p0).m_data = *(undefined8 *)(polysBegin->p0).m_data;
        *(undefined8 *)((pTVar6->p0).m_data + 2) = uVar1;
        uVar1 = *(undefined8 *)((polysBegin->c0).m_data + 2);
        *(undefined8 *)(pTVar6->c0).m_data = *(undefined8 *)(polysBegin->c0).m_data;
        *(undefined8 *)((pTVar6->c0).m_data + 2) = uVar1;
        uVar1 = *(undefined8 *)((polysBegin->p1).m_data + 2);
        *(undefined8 *)(pTVar6->p1).m_data = *(undefined8 *)(polysBegin->p1).m_data;
        *(undefined8 *)((pTVar6->p1).m_data + 2) = uVar1;
        uVar1 = *(undefined8 *)((polysBegin->c1).m_data + 2);
        *(undefined8 *)(pTVar6->c1).m_data = *(undefined8 *)(polysBegin->c1).m_data;
        *(undefined8 *)((pTVar6->c1).m_data + 2) = uVar1;
        uVar1 = *(undefined8 *)((polysBegin->p2).m_data + 2);
        *(undefined8 *)(pTVar6->p2).m_data = *(undefined8 *)(polysBegin->p2).m_data;
        *(undefined8 *)((pTVar6->p2).m_data + 2) = uVar1;
        uVar1 = *(undefined8 *)((polysBegin->c2).m_data + 2);
        *(undefined8 *)(pTVar6->c2).m_data = *(undefined8 *)(polysBegin->c2).m_data;
        *(undefined8 *)((pTVar6->c2).m_data + 2) = uVar1;
        polysBegin = polysBegin + 1;
        pTVar6 = pTVar6 + 1;
      } while (polysBegin != polysEnd);
    }
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar6;
    iVar2 = viewport->bottom;
    iVar3 = viewport->width;
    iVar4 = viewport->height;
    (this->m_viewport).left = viewport->left;
    (this->m_viewport).bottom = iVar2;
    (this->m_viewport).width = iVar3;
    (this->m_viewport).height = iVar4;
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

TriangleCaseBase::TriangleCaseBase (Context& context, const char* name, const char* description, const TriangleData* polysBegin, const TriangleData* polysEnd, const rr::WindowRectangle& viewport)
	: RenderTestCase(context, name, description)
	, m_polys		(polysBegin, polysEnd)
	, m_viewport	(viewport)
{
}